

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixmapstyle.cpp
# Opt level: O3

SubControl __thiscall
QPixmapStyle::hitTestComplexControl
          (QPixmapStyle *this,ComplexControl control,QStyleOptionComplex *option,QPoint *pos,
          QWidget *widget)

{
  SubControl SVar1;
  
  SVar1 = QCommonStyle::hitTestComplexControl(&this->super_QCommonStyle,control,option,pos,widget);
  if (control == CC_ScrollBar) {
    if (SVar1 == SC_ComboBoxFrame) {
      SVar1 = SC_ComboBoxArrow;
    }
    else if (SVar1 == SC_ComboBoxEditField) {
      SVar1 = SC_ComboBoxListBoxPopup;
    }
  }
  return SVar1;
}

Assistant:

QStyle::SubControl QPixmapStyle::hitTestComplexControl(QStyle::ComplexControl control,
                                                       const QStyleOptionComplex *option,
                                                       const QPoint &pos,
                                                       const QWidget *widget) const
{
    const SubControl sc = QCommonStyle::hitTestComplexControl(control, option, pos, widget);
    if (control == CC_ScrollBar) {
        if (sc == SC_ScrollBarAddLine)
            return SC_ScrollBarAddPage;
        else if (sc == SC_ScrollBarSubLine)
            return SC_ScrollBarSubPage;
    }

    return sc;
}